

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O2

el_status_t h_search(void)

{
  el_status_t eVar1;
  char *p;
  code *pcVar2;
  
  if (Searching == '\x01') {
    el_ring_bell();
  }
  else {
    Searching = '\x01';
    clear_line();
    old_prompt = rl_prompt;
    rl_prompt = "Search: ";
    tty_puts("Search: ");
    pcVar2 = el_next_hist;
    if (Repeat == -1) {
      pcVar2 = el_prev_hist;
    }
    search_move = pcVar2;
    if (line_handler == (rl_vcpfunc_t *)0x0) {
      p = editinput(1);
      eVar1 = h_search_end(p);
      return eVar1;
    }
    editinput(0);
  }
  return CSstay;
}

Assistant:

static el_status_t h_search(void)
{
    if (Searching)
        return el_ring_bell();
    Searching = 1;

    clear_line();
    old_prompt = rl_prompt;
    rl_prompt = "Search: ";
    tty_puts(rl_prompt);

    search_move = Repeat == NO_ARG ? el_prev_hist : el_next_hist;
    if (line_handler) {
        editinput(0);
        return CSstay;
    }

    return h_search_end(editinput(1));
}